

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O3

float Abc_ObjDelayDegree(Abc_IffMan_t *p,Abc_Obj_t *pObj,int d)

{
  int fDelay1;
  Ifif_Par_t *pIVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Abc_Obj_t *ppNodes [6];
  Abc_Obj_t *local_48 [6];
  
  if ((d < 0) || (fDelay1 = p->pPars->nDegree, fDelay1 < d)) {
    __assert_fail("d >= 0 && d <= p->pPars->nDegree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIfif.c"
                  ,0xe8,"float Abc_ObjDelayDegree(Abc_IffMan_t *, Abc_Obj_t *, int)");
  }
  Abc_ObjSortByDelay(p,pObj,fDelay1,local_48);
  lVar2 = (long)(pObj->vFanins).nSize;
  if (lVar2 < 1) {
    fVar5 = 0.0;
  }
  else {
    pIVar1 = p->pPars;
    fVar5 = 0.0;
    lVar3 = 0;
    do {
      lVar4 = (long)local_48[lVar3]->Id;
      if ((lVar4 < 0) || (p->nObjs <= local_48[lVar3]->Id)) {
        __assert_fail("i >= 0 && i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIfif.c"
                      ,0x33,"Abc_IffObj_t *Abc_IffObj(Abc_IffMan_t *, int)");
      }
      fVar6 = p->pObjs[lVar4].Delay[pIVar1->nDegree] + pIVar1->pLutDelays[lVar3];
      if ((lVar3 == 0 && d != 0) &&
         (fVar7 = (pIVar1->pLutDelays[lVar3] + p->pObjs[lVar4].Delay[d + -1]) - pIVar1->DelayWire,
         fVar7 <= fVar6)) {
        fVar6 = fVar7;
      }
      if (fVar5 <= fVar6) {
        fVar5 = fVar6;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return fVar5;
}

Assistant:

float Abc_ObjDelayDegree( Abc_IffMan_t * p, Abc_Obj_t * pObj, int d )
{
    int i;
    float Delay0 = 0, DelayNew;
    Abc_Obj_t * ppNodes[6];
    assert( d >= 0 && d <= p->pPars->nDegree );
    Abc_ObjSortByDelay( p, pObj, p->pPars->nDegree, ppNodes );
    for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
    {
        DelayNew = Abc_IffDelay(p, ppNodes[i], p->pPars->nDegree) + p->pPars->pLutDelays[i];
        if ( i == 0 && d > 0 )
            DelayNew = Abc_MinFloat(DelayNew, Abc_IffDelay(p, ppNodes[i], d-1) + p->pPars->pLutDelays[i] - p->pPars->DelayWire );
        Delay0 = Abc_MaxFloat( Delay0, DelayNew );
    }
    return Delay0;
}